

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

sunrealtype N_VWL2Norm_Serial(N_Vector x,N_Vector w)

{
  long *in_RSI;
  long *in_RDI;
  double dVar1;
  sunrealtype *wd;
  sunrealtype *xd;
  sunrealtype prodi;
  sunrealtype sum;
  sunindextype N;
  sunindextype i;
  undefined8 local_48;
  undefined8 local_28;
  undefined8 local_18;
  
  local_28 = 0.0;
  for (local_18 = 0; local_18 < *(long *)*in_RDI; local_18 = local_18 + 1) {
    dVar1 = *(double *)(*(long *)(*in_RDI + 0x10) + local_18 * 8) *
            *(double *)(*(long *)(*in_RSI + 0x10) + local_18 * 8);
    local_28 = dVar1 * dVar1 + local_28;
  }
  if (0.0 < local_28) {
    local_48 = sqrt(local_28);
  }
  else {
    local_48 = 0.0;
  }
  return local_48;
}

Assistant:

sunrealtype N_VWL2Norm_Serial(N_Vector x, N_Vector w)
{
  sunindextype i, N;
  sunrealtype sum, prodi, *xd, *wd;

  sum = ZERO;
  xd = wd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  wd = NV_DATA_S(w);

  for (i = 0; i < N; i++)
  {
    prodi = xd[i] * wd[i];
    sum += SUNSQR(prodi);
  }

  return (SUNRsqrt(sum));
}